

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_verify(uint8_t *public_key,uint8_t *message_hash,uint hash_size,uint8_t *signature,
               uECC_Curve curve)

{
  uECC_word_t *mod;
  size_t __n;
  uECC_word_t *mod_00;
  ulong *puVar1;
  char num_words;
  char cVar2;
  int iVar3;
  wordcount_t i;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  char num_words_00;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  wordcount_t max_words;
  wordcount_t i_1;
  int iVar14;
  uECC_word_t *Y2;
  bool bVar15;
  uECC_word_t rx [4];
  uECC_word_t z [4];
  uECC_word_t r [4];
  uECC_word_t *points [4];
  uECC_word_t s [4];
  uECC_word_t ty [4];
  uECC_word_t tx [4];
  uECC_word_t u1 [4];
  uECC_word_t ry [4];
  uECC_word_t u2 [4];
  uECC_word_t _public [8];
  uECC_word_t tz [4];
  uECC_word_t sum [8];
  uECC_word_t product [8];
  ulong auStack_1178 [8];
  ulong auStack_1138 [473];
  undefined8 uStack_270;
  uECC_word_t local_268 [4];
  uECC_word_t *local_248;
  ulong local_240;
  uECC_word_t local_238 [4];
  uECC_word_t local_218 [4];
  long local_1f8;
  uECC_word_t *local_1f0;
  uECC_word_t *local_1e8;
  uECC_word_t *local_1e0;
  uECC_word_t local_1d8 [4];
  uECC_word_t local_1b8 [4];
  uECC_word_t local_198 [4];
  uECC_word_t local_178 [4];
  uECC_word_t local_158 [4];
  uECC_word_t local_138 [4];
  uECC_word_t local_118 [8];
  uECC_word_t local_d8 [4];
  uECC_word_t local_b8 [8];
  uECC_word_t local_78 [9];
  
  iVar14 = curve->num_n_bits + 0x3f;
  iVar3 = curve->num_n_bits + 0x7e;
  if (-1 < iVar14) {
    iVar3 = iVar14;
  }
  num_words = curve->num_words;
  lVar13 = (long)num_words;
  num_words_00 = (char)(iVar3 >> 6);
  (&uStack_270)[num_words_00] = 0;
  local_218[(long)num_words_00 + -1] = 0;
  local_1d8[(long)num_words_00 + -1] = 0;
  cVar2 = curve->num_bytes;
  uECC_vli_bytesToNative(local_118,public_key,(int)cVar2);
  uECC_vli_bytesToNative(local_118 + lVar13,public_key + cVar2,(int)cVar2);
  uECC_vli_bytesToNative(local_218,signature,(int)cVar2);
  uECC_vli_bytesToNative(local_1d8,signature + cVar2,(int)cVar2);
  if (0 < lVar13) {
    lVar7 = 0;
    uVar10 = 0;
    do {
      uVar10 = uVar10 | local_218[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar13 != lVar7);
    if (uVar10 != 0) {
      lVar7 = 0;
      uVar10 = 0;
      do {
        uVar10 = uVar10 | local_1d8[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar13 != lVar7);
      if (uVar10 != 0) {
        mod = curve->n;
        local_240 = (ulong)(uint)(iVar3 >> 6) & 0xff;
        uVar10 = local_240;
        do {
          uVar10 = uVar10 - 1;
          if ((char)uVar10 < '\0') {
            return 0;
          }
          uVar12 = (ulong)(((uint)uVar10 & 0x7f) << 3);
          uVar9 = *(ulong *)((long)mod + uVar12);
          uVar12 = *(ulong *)((long)local_218 + uVar12);
          uVar8 = local_240;
          if (uVar12 < uVar9) goto LAB_001090c5;
        } while (uVar12 <= uVar9);
      }
    }
  }
  return 0;
LAB_001090c5:
  while( true ) {
    uVar8 = uVar8 - 1;
    if ((char)uVar8 < '\0') {
      return 0;
    }
    uVar9 = (ulong)(((uint)uVar8 & 0x7f) << 3);
    uVar10 = *(ulong *)((long)mod + uVar9);
    uVar9 = *(ulong *)((long)local_1d8 + uVar9);
    if (uVar9 < uVar10) break;
    if (uVar10 < uVar9) {
      return 0;
    }
  }
  uECC_vli_modInv(local_238,local_1d8,mod,num_words_00);
  lVar7 = 0;
  local_158[(long)num_words_00 + -5] = 0;
  bits2int(local_178,message_hash,hash_size,curve);
  uStack_270._4_4_ = (int)num_words_00;
  uECC_vli_modMult(local_178,local_178,local_238,mod,num_words_00);
  uECC_vli_modMult(local_138,local_218,local_238,mod,num_words_00);
  __n = lVar13 * 8;
  memcpy(local_b8,local_118,__n);
  Y2 = local_b8 + lVar13;
  memcpy(Y2,local_118 + lVar13,__n);
  local_248 = curve->G;
  memcpy(local_198,local_248,__n);
  memcpy(local_1b8,curve->G + lVar13,__n);
  mod_00 = curve->p;
  uECC_vli_modSub(local_238,local_b8,local_198,mod_00,num_words);
  XYcZ_add(local_198,local_1b8,local_b8,Y2,curve);
  uECC_vli_modInv(local_238,local_238,mod_00,num_words);
  apply_z(local_b8,Y2,local_238,curve);
  local_1f8 = 0;
  local_1f0 = local_248;
  local_1e8 = local_118;
  max_words = (wordcount_t)uStack_270._4_4_;
  local_1e0 = local_b8;
  uVar4 = uECC_vli_numBits(local_178,max_words);
  uVar5 = uECC_vli_numBits(local_138,max_words);
  if ((short)uVar5 < (short)uVar4) {
    uVar5 = uVar4;
  }
  uVar6 = uVar5 - 1;
  lVar11 = (long)((int)(short)uVar6 >> 6);
  lVar11 = *(long *)((long)&local_1f8 +
                    (ulong)((uint)((local_138[lVar11] >> ((ulong)uVar6 & 0x3f) & 1) != 0) * 0x10 +
                           (uint)((local_158[lVar11 + -4] >> ((ulong)uVar6 & 0x3f) & 1) != 0) * 8));
  do {
    local_268[lVar7] = *(uECC_word_t *)(lVar11 + lVar7 * 8);
    lVar7 = lVar7 + 1;
  } while (lVar13 != lVar7);
  lVar7 = 0;
  do {
    local_158[lVar7] = *(uECC_word_t *)(lVar11 + lVar13 * 8 + lVar7 * 8);
    lVar7 = lVar7 + 1;
  } while (lVar13 != lVar7);
  memset(local_238,0,__n);
  local_238[0] = 1;
  if (-1 < (short)(uVar5 - 2)) {
    uVar10 = (ulong)(ushort)(uVar5 - 2);
    do {
      (*curve->double_jacobian)(local_268,local_158,local_238,curve);
      iVar14 = (int)uVar10;
      lVar7 = *(long *)((long)&local_1f8 +
                       (ulong)((uint)((local_138[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) * 0x10 +
                              (uint)((local_158[(uVar10 >> 6) - 4] >> (uVar10 & 0x3f) & 1) != 0) * 8
                              ));
      if (lVar7 != 0) {
        lVar11 = 0;
        do {
          local_198[lVar11] = *(uECC_word_t *)(lVar7 + lVar11 * 8);
          lVar11 = lVar11 + 1;
        } while (lVar13 != lVar11);
        lVar11 = 0;
        do {
          local_1b8[lVar11] = *(uECC_word_t *)(lVar7 + lVar13 * 8 + lVar11 * 8);
          lVar11 = lVar11 + 1;
        } while (lVar13 != lVar11);
        apply_z(local_198,local_1b8,local_238,curve);
        uECC_vli_modSub(local_d8,local_268,local_198,mod_00,num_words);
        XYcZ_add(local_198,local_1b8,local_268,local_158,curve);
        uECC_vli_mult(local_78,local_238,local_d8,curve->num_words);
        (*curve->mmod_fast)(local_238,local_78);
      }
      uVar10 = (ulong)(iVar14 - 1);
    } while (0 < iVar14);
  }
  uECC_vli_modInv(local_238,local_238,mod_00,num_words);
  apply_z(local_268,local_158,local_238,curve);
  uVar10 = local_240;
  do {
    uVar10 = uVar10 - 1;
    if ((char)uVar10 < '\0') break;
    uVar12 = (ulong)(((uint)uVar10 & 0x7f) << 3);
    uVar9 = *(ulong *)((long)mod + uVar12);
    uVar12 = *(ulong *)((long)local_268 + uVar12);
    if (uVar12 < uVar9) goto LAB_00109508;
  } while (uVar12 <= uVar9);
  if ('\0' < num_words_00) {
    uVar9 = 0;
    uVar10 = 0;
    do {
      uVar8 = mod[uVar9] + uVar10;
      puVar1 = local_268 + uVar9;
      uVar12 = *puVar1;
      *puVar1 = *puVar1 - uVar8;
      if (uVar8 != 0) {
        uVar10 = (ulong)(uVar12 < uVar8);
      }
      uVar9 = uVar9 + 1;
    } while (local_240 != uVar9);
  }
LAB_00109508:
  uVar9 = (ulong)((int)num_words - 1U & 0xff);
  uVar10 = 0;
  do {
    uVar10 = uVar10 | local_218[uVar9] ^ local_268[uVar9];
    bVar15 = uVar9 != 0;
    uVar9 = uVar9 - 1;
  } while (bVar15);
  return (uint)(uVar10 == 0);
}

Assistant:

int uECC_verify(const uint8_t *public_key,
                const uint8_t *message_hash,
                unsigned hash_size,
                const uint8_t *signature,
                uECC_Curve curve) {
    uECC_word_t u1[uECC_MAX_WORDS], u2[uECC_MAX_WORDS];
    uECC_word_t z[uECC_MAX_WORDS];
    uECC_word_t sum[uECC_MAX_WORDS * 2];
    uECC_word_t rx[uECC_MAX_WORDS];
    uECC_word_t ry[uECC_MAX_WORDS];
    uECC_word_t tx[uECC_MAX_WORDS];
    uECC_word_t ty[uECC_MAX_WORDS];
    uECC_word_t tz[uECC_MAX_WORDS];
    const uECC_word_t *points[4];
    const uECC_word_t *point;
    bitcount_t num_bits;
    bitcount_t i;
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif    
    uECC_word_t r[uECC_MAX_WORDS], s[uECC_MAX_WORDS];
    wordcount_t num_words = curve->num_words;
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);

    rx[num_n_words - 1] = 0;
    r[num_n_words - 1] = 0;
    s[num_n_words - 1] = 0;

#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) r, signature, curve->num_bytes);
    bcopy((uint8_t *) s, signature + curve->num_bytes, curve->num_bytes);
#else
    uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
    uECC_vli_bytesToNative(
        _public + num_words, public_key + curve->num_bytes, curve->num_bytes);
    uECC_vli_bytesToNative(r, signature, curve->num_bytes);
    uECC_vli_bytesToNative(s, signature + curve->num_bytes, curve->num_bytes);
#endif

    /* r, s must not be 0. */
    if (uECC_vli_isZero(r, num_words) || uECC_vli_isZero(s, num_words)) {
        return 0;
    }

    /* r, s must be < n. */
    if (uECC_vli_cmp_unsafe(curve->n, r, num_n_words) != 1 ||
            uECC_vli_cmp_unsafe(curve->n, s, num_n_words) != 1) {
        return 0;
    }

    /* Calculate u1 and u2. */
    uECC_vli_modInv(z, s, curve->n, num_n_words); /* z = 1/s */
    u1[num_n_words - 1] = 0;
    bits2int(u1, message_hash, hash_size, curve);
    uECC_vli_modMult(u1, u1, z, curve->n, num_n_words); /* u1 = e/s */
    uECC_vli_modMult(u2, r, z, curve->n, num_n_words); /* u2 = r/s */

    /* Calculate sum = G + Q. */
    uECC_vli_set(sum, _public, num_words);
    uECC_vli_set(sum + num_words, _public + num_words, num_words);
    uECC_vli_set(tx, curve->G, num_words);
    uECC_vli_set(ty, curve->G + num_words, num_words);
    uECC_vli_modSub(z, sum, tx, curve->p, num_words); /* z = x2 - x1 */
    XYcZ_add(tx, ty, sum, sum + num_words, curve);
    uECC_vli_modInv(z, z, curve->p, num_words); /* z = 1/z */
    apply_z(sum, sum + num_words, z, curve);

    /* Use Shamir's trick to calculate u1*G + u2*Q */
    points[0] = 0;
    points[1] = curve->G;
    points[2] = _public;
    points[3] = sum;
    num_bits = smax(uECC_vli_numBits(u1, num_n_words),
                    uECC_vli_numBits(u2, num_n_words));

    point = points[(!!uECC_vli_testBit(u1, num_bits - 1)) |
                   ((!!uECC_vli_testBit(u2, num_bits - 1)) << 1)];
    uECC_vli_set(rx, point, num_words);
    uECC_vli_set(ry, point + num_words, num_words);
    uECC_vli_clear(z, num_words);
    z[0] = 1;

    for (i = num_bits - 2; i >= 0; --i) {
        uECC_word_t index;
        curve->double_jacobian(rx, ry, z, curve);

        index = (!!uECC_vli_testBit(u1, i)) | ((!!uECC_vli_testBit(u2, i)) << 1);
        point = points[index];
        if (point) {
            uECC_vli_set(tx, point, num_words);
            uECC_vli_set(ty, point + num_words, num_words);
            apply_z(tx, ty, z, curve);
            uECC_vli_modSub(tz, rx, tx, curve->p, num_words); /* Z = x2 - x1 */
            XYcZ_add(tx, ty, rx, ry, curve);
            uECC_vli_modMult_fast(z, z, tz, curve);
        }
    }

    uECC_vli_modInv(z, z, curve->p, num_words); /* Z = 1/Z */
    apply_z(rx, ry, z, curve);

    /* v = x1 (mod n) */
    if (uECC_vli_cmp_unsafe(curve->n, rx, num_n_words) != 1) {
        uECC_vli_sub(rx, rx, curve->n, num_n_words);
    }

    /* Accept only if v == r. */
    return (int)(uECC_vli_equal(rx, r, num_words));
}